

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O0

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,SamplingStrategyResponse *response)

{
  SamplingStrategyResponse *pSVar1;
  bool bVar2;
  type val;
  const_reference this;
  pointer pbVar3;
  PerOperationSamplingStrategies local_170;
  const_iterator local_130;
  const_iterator local_110;
  RateLimitingSamplingStrategy local_f0;
  const_iterator local_e0;
  const_iterator local_c0;
  ProbabilisticSamplingStrategy local_a0;
  const_iterator local_90;
  undefined1 local_70 [8];
  const_iterator itr;
  allocator local_39;
  key_type local_38;
  SamplingStrategyResponse *local_18;
  SamplingStrategyResponse *response_local;
  json *json_local;
  
  local_18 = response;
  response_local = (SamplingStrategyResponse *)json;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"strategyType",&local_39);
  this = nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::at(json,&local_38);
  val = nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        operator_jaegertracing__sampling_manager__thrift__SamplingStrategyType__type<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type,_0>
                  (this);
  SamplingStrategyResponse::__set_strategyType(response,val);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[22]>
            ((const_iterator *)local_70,response_local,(char (*) [22])"probabilisticSampling");
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_90,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)response_local);
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_90);
  pSVar1 = local_18;
  if (bVar2) {
    pbVar3 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator->((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_70);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_0>
              (&local_a0,pbVar3);
    SamplingStrategyResponse::__set_probabilisticSampling(pSVar1,&local_a0);
    ProbabilisticSamplingStrategy::~ProbabilisticSamplingStrategy(&local_a0);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[21]>(&local_c0,response_local,(char (*) [21])"rateLimitingSampling");
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::operator=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_70,&local_c0);
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_e0,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)response_local);
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_e0);
  pSVar1 = local_18;
  if (bVar2) {
    pbVar3 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator->((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_70);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy,_jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy,_0>
              (&local_f0,pbVar3);
    SamplingStrategyResponse::__set_rateLimitingSampling(pSVar1,&local_f0);
    RateLimitingSamplingStrategy::~RateLimitingSamplingStrategy(&local_f0);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[18]>(&local_110,response_local,(char (*) [18])"operationSampling");
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::operator=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_70,&local_110);
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_130,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)response_local);
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_130);
  pSVar1 = local_18;
  if (bVar2) {
    pbVar3 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator->((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_70);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies,_jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies,_0>
              (&local_170,pbVar3);
    SamplingStrategyResponse::__set_operationSampling(pSVar1,&local_170);
    PerOperationSamplingStrategies::~PerOperationSamplingStrategies(&local_170);
  }
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      SamplingStrategyResponse& response)
{
    FIELD_FROM_JSON(response, strategyType);
    auto itr = json.find("probabilisticSampling");
    if (itr != std::end(json)) {
        response.__set_probabilisticSampling(
            itr->get<ProbabilisticSamplingStrategy>());
    }
    itr = json.find("rateLimitingSampling");
    if (itr != std::end(json)) {
        response.__set_rateLimitingSampling(
            itr->get<RateLimitingSamplingStrategy>());
    }
    itr = json.find("operationSampling");
    if (itr != std::end(json)) {
        response.__set_operationSampling(
            itr->get<PerOperationSamplingStrategies>());
    }
}